

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_replace(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int is_replaceAll)

{
  int64_t iVar1;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue val_02;
  JSValue JVar2;
  JSValue this_obj;
  JSValue func_obj;
  JSValue func_obj_00;
  JSValue JVar3;
  JSValue obj;
  JSValue v_07;
  JSValue v_08;
  long lVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue *in_R8;
  int in_R9D;
  JSValue JVar8;
  JSValue JVar9;
  JSValue replacer;
  BOOL is_first;
  int endOfLastMatch;
  int functionalReplace;
  int pos;
  StringBuffer *b;
  StringBuffer b_s;
  JSString *searchp;
  JSString *sp;
  JSValue repl_str;
  JSValue replaceValue_str;
  JSValue search_str;
  JSValue str;
  JSValue args [6];
  JSValue replaceValue;
  JSValue searchValue;
  JSValue O;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  JSValueUnion *pJVar10;
  JSContext *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  StringBuffer *in_stack_fffffffffffffd28;
  JSValue in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd40;
  uint in_stack_fffffffffffffd44;
  undefined8 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  uint in_stack_fffffffffffffd54;
  JSValueUnion in_stack_fffffffffffffd58;
  JSValueUnion in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  JSValue in_stack_fffffffffffffd80;
  JSValueUnion local_270;
  int64_t local_268;
  JSValueUnion local_240;
  int64_t local_238;
  JSValueUnion local_230;
  int64_t local_228;
  uint uStack_1fc;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffe24;
  undefined8 uVar12;
  int iVar13;
  int iVar14;
  undefined1 *puVar15;
  undefined1 local_1b8 [20];
  JSAtom in_stack_fffffffffffffe5c;
  JSContext *in_stack_fffffffffffffe60;
  JSValueUnion in_stack_fffffffffffffe68;
  JSValueUnion JVar16;
  int64_t in_stack_fffffffffffffe70;
  JSValueUnion JVar17;
  int64_t iVar18;
  JSValueUnion local_148;
  int64_t iStack_140;
  JSValueUnion local_138;
  int64_t iStack_130;
  JSValueUnion local_128;
  int64_t local_120;
  long local_118;
  undefined8 local_110;
  long local_108;
  BOOL in_stack_ffffffffffffff00;
  JSValueUnion local_80;
  int64_t local_78;
  undefined4 uStack_2c;
  undefined4 uStack_c;
  
  JVar3 = *in_R8;
  JVar9 = *in_R8;
  JVar16 = in_R8[1].u;
  iVar1 = in_R8[1].tag;
  JVar2 = in_R8[1];
  puVar15 = local_1b8;
  JVar8.tag = in_RDX;
  JVar8.u.ptr = in_RSI.ptr;
  iVar6 = JS_IsUndefined(JVar8);
  if ((iVar6 != 0) ||
     (v_08.tag = in_RDX, v_08.u.ptr = in_RSI.ptr, iVar6 = JS_IsNull(v_08), iVar6 != 0)) {
    JVar8 = JS_ThrowTypeError(in_RDI,"cannot convert to object");
    return JVar8;
  }
  uVar11 = 0;
  uVar12 = 0;
  JVar17.ptr = (void *)((ulong)uStack_1fc << 0x20);
  iVar18 = 3;
  iVar6 = JS_IsUndefined(JVar9);
  lVar4 = local_80;
  if ((iVar6 == 0) && (iVar6 = JS_IsNull(JVar3), iVar6 == 0)) {
    if ((in_R9D != 0) &&
       (JVar9.tag._0_4_ = in_stack_fffffffffffffd70,
       JVar9.u = (JSValueUnion)in_stack_fffffffffffffd68,
       JVar9.tag._4_4_ = in_stack_fffffffffffffd74,
       iVar6 = check_regexp_g_flag((JSContext *)in_stack_fffffffffffffd60.ptr,JVar9), iVar6 < 0)) {
      local_80.ptr = (void *)(lVar4 << 0x20);
      local_78 = 6;
      return _local_80;
    }
    in_stack_fffffffffffffd08 = 0;
    obj.tag = iVar18;
    obj.u.ptr = JVar17.ptr;
    JVar3.tag = in_stack_fffffffffffffe70;
    JVar3.u.float64 = in_stack_fffffffffffffe68.float64;
    JVar8 = JS_GetPropertyInternal
                      (in_stack_fffffffffffffe60,obj,in_stack_fffffffffffffe5c,JVar3,
                       in_stack_ffffffffffffff00);
    iVar6 = JS_IsException(JVar8);
    if (iVar6 != 0) {
      local_80.ptr = (void *)(lVar4 << 0x20);
      local_78 = 6;
      return _local_80;
    }
    iVar6 = JS_IsUndefined(JVar8);
    if ((iVar6 == 0) && (iVar6 = JS_IsNull(JVar8), iVar6 == 0)) {
      func_obj.tag = (int64_t)in_stack_fffffffffffffd60.ptr;
      func_obj.u.float64 = in_stack_fffffffffffffd58.float64;
      JVar2.tag._0_4_ = in_stack_fffffffffffffd50;
      JVar2.u = (JSValueUnion)in_stack_fffffffffffffd48;
      JVar2.tag._4_4_ = in_stack_fffffffffffffd54;
      local_138 = JVar16;
      iStack_130 = iVar1;
      JVar8 = JS_CallFree((JSContext *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40)
                          ,func_obj,JVar2,in_stack_fffffffffffffd30.tag._4_4_,
                          (JSValue *)in_stack_fffffffffffffd80.u.ptr);
      return JVar8;
    }
  }
  string_buffer_init(in_stack_fffffffffffffd10,
                     (StringBuffer *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),0
                    );
  val.u._4_4_ = in_stack_fffffffffffffd0c;
  val.u.int32 = in_stack_fffffffffffffd08;
  val.tag = (int64_t)in_stack_fffffffffffffd10;
  JVar8 = JS_ToString((JSContext *)0x1bad69,val);
  local_230 = JVar8.u;
  local_228 = JVar8.tag;
  iVar6 = JS_IsException(JVar8);
  if (iVar6 == 0) {
    val_00.u._4_4_ = in_stack_fffffffffffffd0c;
    val_00.u.int32 = in_stack_fffffffffffffd08;
    val_00.tag = (int64_t)in_stack_fffffffffffffd10;
    JVar9 = JS_ToString((JSContext *)0x1badd5,val_00);
    local_240 = JVar9.u;
    local_238 = JVar9.tag;
    iVar6 = JS_IsException(JVar9);
    if (iVar6 == 0) {
      iVar6 = JS_IsFunction(in_RDI,JVar2);
      if (iVar6 == 0) {
        val_01.u._4_4_ = in_stack_fffffffffffffd0c;
        val_01.u.int32 = in_stack_fffffffffffffd08;
        val_01.tag = (int64_t)in_stack_fffffffffffffd10;
        JVar9 = JS_ToString((JSContext *)0x1bae6f,val_01);
        iVar7 = JS_IsException(JVar9);
        if (iVar7 != 0) goto LAB_001bb423;
      }
      pJVar10 = (JSValueUnion *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08);
      iVar7 = 0;
      iVar13 = 1;
      JVar16 = local_240;
      JVar17 = local_230;
      do {
        if ((*(ulong *)((long)JVar16.ptr + 4) & 0x7fffffff) == 0) {
          if (iVar13 == 0) {
            if (iVar7 < (int)((uint)*(undefined8 *)((long)JVar17.ptr + 4) & 0x7fffffff)) {
              iVar14 = iVar7 + 1;
            }
            else {
              iVar14 = -1;
            }
          }
          else {
            iVar14 = 0;
          }
        }
        else {
          iVar14 = string_indexof((JSString *)in_stack_fffffffffffffd28,
                                  (JSString *)
                                  CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                  in_stack_fffffffffffffd1c);
        }
        if (iVar14 < 0) {
          if (iVar13 != 0) {
            string_buffer_free((StringBuffer *)0x1bafba);
            v.u._4_4_ = in_stack_fffffffffffffd1c;
            v.u.int32 = in_stack_fffffffffffffd18;
            v.tag._0_4_ = in_stack_fffffffffffffd20;
            v.tag._4_4_ = in_stack_fffffffffffffd24;
            JS_FreeValue(in_stack_fffffffffffffd10,v);
            v_00.u._4_4_ = in_stack_fffffffffffffd1c;
            v_00.u.int32 = in_stack_fffffffffffffd18;
            v_00.tag._0_4_ = in_stack_fffffffffffffd20;
            v_00.tag._4_4_ = in_stack_fffffffffffffd24;
            JS_FreeValue(in_stack_fffffffffffffd10,v_00);
            return JVar8;
          }
          break;
        }
        if (iVar6 == 0) {
          local_148.float64 = local_240.float64;
          iStack_140 = local_238;
          local_138.float64 = local_230.float64;
          iStack_130 = local_228;
          in_stack_fffffffffffffd60._4_4_ = uStack_2c;
          in_stack_fffffffffffffd60.int32 = iVar14;
          local_120 = 0;
          in_stack_fffffffffffffd50 = 0;
          in_stack_fffffffffffffd58.float64 = 1.48219693752374e-323;
          local_118 = (ulong)in_stack_fffffffffffffd54 << 0x20;
          local_110 = 3;
          in_stack_fffffffffffffd40 = 0;
          in_stack_fffffffffffffd48 = 3;
          local_108 = (ulong)in_stack_fffffffffffffd44 << 0x20;
          in_stack_fffffffffffffd20 = 0;
          in_stack_fffffffffffffd28 = (StringBuffer *)0x3;
          auVar5._4_8_ = puVar15;
          auVar5._0_4_ = iVar14;
          auVar5._12_4_ = 0;
          local_128 = in_stack_fffffffffffffd60;
          in_stack_fffffffffffffd30 =
               js_string___GetSubstitution
                         ((JSContext *)CONCAT44(iVar7,iVar13),(JSValue)(auVar5 << 0x20),
                          (int)((ulong)uVar12 >> 0x20),
                          (JSValue *)CONCAT44(in_stack_fffffffffffffe24,uVar11));
          local_270 = in_stack_fffffffffffffd30.u;
          local_268 = in_stack_fffffffffffffd30.tag;
        }
        else {
          local_148.float64 = local_240.float64;
          iStack_140 = local_238;
          local_138._4_4_ = uStack_c;
          local_138.int32 = iVar14;
          iStack_130 = 0;
          local_128.float64 = local_230.float64;
          local_120 = local_228;
          in_stack_fffffffffffffd18 = SUB84(in_RDI,0);
          in_stack_fffffffffffffd1c = (int)((ulong)in_RDI >> 0x20);
          pJVar10 = &local_148;
          func_obj_00.tag = (int64_t)in_stack_fffffffffffffd60.ptr;
          func_obj_00.u.float64 = in_stack_fffffffffffffd58.float64;
          this_obj.tag._0_4_ = in_stack_fffffffffffffd50;
          this_obj.u = (JSValueUnion)in_stack_fffffffffffffd48;
          this_obj.tag._4_4_ = in_stack_fffffffffffffd54;
          in_stack_fffffffffffffd80 =
               JS_Call((JSContext *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                       func_obj_00,this_obj,in_stack_fffffffffffffd30.tag._4_4_,
                       (JSValue *)in_stack_fffffffffffffd80.u.ptr);
          val_02.u._4_4_ = in_stack_fffffffffffffd24;
          val_02.u.int32 = in_stack_fffffffffffffd20;
          val_02.tag = (int64_t)in_stack_fffffffffffffd28;
          JVar9 = JS_ToStringFree((JSContext *)
                                  CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                  val_02);
          local_270 = JVar9.u;
          local_268 = JVar9.tag;
        }
        v_07.tag = local_268;
        v_07.u.float64 = local_270.float64;
        iVar7 = JS_IsException(v_07);
        if (iVar7 != 0) goto LAB_001bb423;
        string_buffer_concat
                  ((StringBuffer *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                   (JSString *)in_stack_fffffffffffffd10,(uint32_t)((ulong)pJVar10 >> 0x20),
                   (uint32_t)pJVar10);
        string_buffer_concat_value_free(in_stack_fffffffffffffd28,in_stack_fffffffffffffd30);
        iVar7 = iVar14 + ((uint)*(undefined8 *)((long)JVar16.ptr + 4) & 0x7fffffff);
        iVar13 = 0;
      } while (in_R9D != 0);
      string_buffer_concat
                ((StringBuffer *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (JSString *)in_stack_fffffffffffffd10,(uint32_t)((ulong)pJVar10 >> 0x20),
                 (uint32_t)pJVar10);
      v_01.u._4_4_ = in_stack_fffffffffffffd1c;
      v_01.u.int32 = in_stack_fffffffffffffd18;
      v_01.tag._0_4_ = in_stack_fffffffffffffd20;
      v_01.tag._4_4_ = in_stack_fffffffffffffd24;
      JS_FreeValue(in_stack_fffffffffffffd10,v_01);
      v_02.u._4_4_ = in_stack_fffffffffffffd1c;
      v_02.u.int32 = in_stack_fffffffffffffd18;
      v_02.tag._0_4_ = in_stack_fffffffffffffd20;
      v_02.tag._4_4_ = in_stack_fffffffffffffd24;
      JS_FreeValue(in_stack_fffffffffffffd10,v_02);
      v_03.u._4_4_ = in_stack_fffffffffffffd1c;
      v_03.u.int32 = in_stack_fffffffffffffd18;
      v_03.tag._0_4_ = in_stack_fffffffffffffd20;
      v_03.tag._4_4_ = in_stack_fffffffffffffd24;
      JS_FreeValue(in_stack_fffffffffffffd10,v_03);
      JVar8 = string_buffer_end((StringBuffer *)in_stack_fffffffffffffd10);
      return JVar8;
    }
  }
LAB_001bb423:
  string_buffer_free((StringBuffer *)0x1bb430);
  v_04.u._4_4_ = in_stack_fffffffffffffd1c;
  v_04.u.int32 = in_stack_fffffffffffffd18;
  v_04.tag._0_4_ = in_stack_fffffffffffffd20;
  v_04.tag._4_4_ = in_stack_fffffffffffffd24;
  JS_FreeValue(in_stack_fffffffffffffd10,v_04);
  v_05.u._4_4_ = in_stack_fffffffffffffd1c;
  v_05.u.int32 = in_stack_fffffffffffffd18;
  v_05.tag._0_4_ = in_stack_fffffffffffffd20;
  v_05.tag._4_4_ = in_stack_fffffffffffffd24;
  JS_FreeValue(in_stack_fffffffffffffd10,v_05);
  v_06.u._4_4_ = in_stack_fffffffffffffd1c;
  v_06.u.int32 = in_stack_fffffffffffffd18;
  v_06.tag._0_4_ = in_stack_fffffffffffffd20;
  v_06.tag._4_4_ = in_stack_fffffffffffffd24;
  JS_FreeValue(in_stack_fffffffffffffd10,v_06);
  local_80.ptr = (void *)(lVar4 << 0x20);
  local_78 = 6;
  return _local_80;
}

Assistant:

static JSValue js_string_replace(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv,
                                 int is_replaceAll)
{
    // replace(rx, rep)
    JSValueConst O = this_val, searchValue = argv[0], replaceValue = argv[1];
    JSValueConst args[6];
    JSValue str, search_str, replaceValue_str, repl_str;
    JSString *sp, *searchp;
    StringBuffer b_s, *b = &b_s;
    int pos, functionalReplace, endOfLastMatch;
    BOOL is_first;

    if (JS_IsUndefined(O) || JS_IsNull(O))
        return JS_ThrowTypeError(ctx, "cannot convert to object");

    search_str = JS_UNDEFINED;
    replaceValue_str = JS_UNDEFINED;
    repl_str = JS_UNDEFINED;

    if (!JS_IsUndefined(searchValue) && !JS_IsNull(searchValue)) {
        JSValue replacer;
        if (is_replaceAll) {
            if (check_regexp_g_flag(ctx, searchValue) < 0)
                return JS_EXCEPTION;
        }
        replacer = JS_GetProperty(ctx, searchValue, JS_ATOM_Symbol_replace);
        if (JS_IsException(replacer))
            return JS_EXCEPTION;
        if (!JS_IsUndefined(replacer) && !JS_IsNull(replacer)) {
            args[0] = O;
            args[1] = replaceValue;
            return JS_CallFree(ctx, replacer, searchValue, 2, args);
        }
    }
    string_buffer_init(ctx, b, 0);

    str = JS_ToString(ctx, O);
    if (JS_IsException(str))
        goto exception;
    search_str = JS_ToString(ctx, searchValue);
    if (JS_IsException(search_str))
        goto exception;
    functionalReplace = JS_IsFunction(ctx, replaceValue);
    if (!functionalReplace) {
        replaceValue_str = JS_ToString(ctx, replaceValue);
        if (JS_IsException(replaceValue_str))
            goto exception;
    }

    sp = JS_VALUE_GET_STRING(str);
    searchp = JS_VALUE_GET_STRING(search_str);
    endOfLastMatch = 0;
    is_first = TRUE;
    for(;;) {
        if (unlikely(searchp->len == 0)) {
            if (is_first)
                pos = 0;
            else if (endOfLastMatch >= sp->len)
                pos = -1;
            else
                pos = endOfLastMatch + 1;
        } else {
            pos = string_indexof(sp, searchp, endOfLastMatch);
        }
        if (pos < 0) {
            if (is_first) {
                string_buffer_free(b);
                JS_FreeValue(ctx, search_str);
                JS_FreeValue(ctx, replaceValue_str);
                return str;
            } else {
                break;
            }
        }
        if (functionalReplace) {
            args[0] = search_str;
            args[1] = JS_NewInt32(ctx, pos);
            args[2] = str;
            repl_str = JS_ToStringFree(ctx, JS_Call(ctx, replaceValue, JS_UNDEFINED, 3, args));
        } else {
            args[0] = search_str;
            args[1] = str;
            args[2] = JS_NewInt32(ctx, pos);
            args[3] = JS_UNDEFINED;
            args[4] = JS_UNDEFINED;
            args[5] = replaceValue_str;
            repl_str = js_string___GetSubstitution(ctx, JS_UNDEFINED, 6, args);
        }
        if (JS_IsException(repl_str))
            goto exception;
        
        string_buffer_concat(b, sp, endOfLastMatch, pos);
        string_buffer_concat_value_free(b, repl_str);
        endOfLastMatch = pos + searchp->len;
        is_first = FALSE;
        if (!is_replaceAll)
            break;
    }
    string_buffer_concat(b, sp, endOfLastMatch, sp->len);
    JS_FreeValue(ctx, search_str);
    JS_FreeValue(ctx, replaceValue_str);
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

exception:
    string_buffer_free(b);
    JS_FreeValue(ctx, search_str);
    JS_FreeValue(ctx, replaceValue_str);
    JS_FreeValue(ctx, str);
    return JS_EXCEPTION;
}